

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vision.c
# Opt level: O3

void unblock_point(int x,int y)

{
  uint __c;
  char cVar1;
  char cVar2;
  int iVar3;
  long lVar4;
  size_t __n;
  int iVar5;
  char *__s;
  
  if (viz_clear[y][x] != '\0') goto LAB_00282d1b;
  viz_clear[y][x] = '\x01';
  if (x == 0x4f) {
    if (viz_clear[y][0x4e] != '\0') {
      left_ptrs[y][0x4f] = left_ptrs[y][0x4e];
      goto LAB_00282d1b;
    }
    left_ptrs[y][0x4f] = 'N';
    lVar4 = (long)left_ptrs[y][0x4e];
    if (0x4e < lVar4) goto LAB_00282d1b;
    __s = right_ptrs[y] + lVar4;
    __n = 0x4f - lVar4;
    iVar5 = 0x4e;
  }
  else {
    if (x != 0) {
      iVar5 = x + -1;
      __c = x + 1;
      cVar1 = viz_clear[y][(int)__c];
      if (viz_clear[y][iVar5] == '\0') {
        iVar3 = (int)left_ptrs[y][iVar5];
        if (cVar1 == '\0') {
          if (iVar3 < x) {
            memset(right_ptrs[y] + iVar3,iVar5,(ulong)(uint)(iVar5 - iVar3) + 1);
          }
          if (x < right_ptrs[y][(int)__c]) {
            memset(left_ptrs[y] + (long)x + 1,__c & 0xff,
                   (ulong)(uint)((int)right_ptrs[y][(int)__c] + ~x) + 1);
          }
          left_ptrs[y][x] = (char)iVar5;
          right_ptrs[y][x] = (char)__c;
        }
        else {
          if (iVar3 < x) {
            memset(right_ptrs[y] + iVar3,iVar5,(ulong)(uint)(iVar5 - iVar3) + 1);
          }
          cVar1 = right_ptrs[y][(int)__c];
          if (x <= cVar1) {
            lVar4 = 0;
            do {
              if (viz_clear[y][lVar4 + x] != '\0') {
                left_ptrs[y][lVar4 + x] = (char)iVar5;
              }
              lVar4 = lVar4 + 1;
            } while ((cVar1 - x) + 1 != (int)lVar4);
          }
          right_ptrs[y][x] = cVar1;
        }
      }
      else if (cVar1 == '\0') {
        if (x < right_ptrs[y][(int)__c]) {
          memset(left_ptrs[y] + (long)x + 1,__c,(ulong)(uint)((int)right_ptrs[y][(int)__c] + ~x) + 1
                );
        }
        cVar1 = left_ptrs[y][iVar5];
        if (cVar1 <= x) {
          lVar4 = (long)(int)cVar1;
          do {
            if (viz_clear[y][lVar4] != '\0') {
              right_ptrs[y][lVar4] = (char)__c;
            }
            lVar4 = lVar4 + 1;
          } while (__c != (uint)lVar4);
        }
        left_ptrs[y][x] = cVar1;
      }
      else {
        cVar1 = left_ptrs[y][iVar5];
        if (cVar1 <= x) {
          lVar4 = (long)(int)cVar1;
          do {
            if (viz_clear[y][lVar4] != '\0') {
              right_ptrs[y][lVar4] = right_ptrs[y][(int)__c];
            }
            lVar4 = lVar4 + 1;
          } while (__c != (uint)lVar4);
        }
        cVar2 = right_ptrs[y][(int)__c];
        if (x <= cVar2) {
          lVar4 = 0;
          do {
            if (viz_clear[y][lVar4 + x] != '\0') {
              left_ptrs[y][lVar4 + x] = cVar1;
            }
            lVar4 = lVar4 + 1;
          } while ((cVar2 - x) + 1 != (int)lVar4);
        }
      }
      goto LAB_00282d1b;
    }
    if (viz_clear[y][1] != '\0') {
      right_ptrs[y][0] = right_ptrs[y][1];
      goto LAB_00282d1b;
    }
    right_ptrs[y][0] = '\x01';
    __n = (size_t)right_ptrs[y][1];
    if ((long)__n < 1) goto LAB_00282d1b;
    __s = left_ptrs[y] + 1;
    iVar5 = 1;
  }
  memset(__s,iVar5,__n);
LAB_00282d1b:
  if (viz_array[y][x] != '\0') {
    vision_full_recalc = '\x01';
  }
  return;
}

Assistant:

static void dig_point(int row, int col)
{
    int i;

    if (viz_clear[row][col]) return;		/* already done */

    viz_clear[row][col] = 1;

    /*
     * Boundary cases first.
     */
    if (col == 0) {				/* left edge */
	if (viz_clear[row][1]) {
	    right_ptrs[row][0] = right_ptrs[row][1];
	} else {
	    right_ptrs[row][0] = 1;
	    for (i = 1; i <= right_ptrs[row][1]; i++)
		left_ptrs[row][i] = 1;
	}
    } else if (col == (COLNO-1)) {		/* right edge */

	if (viz_clear[row][COLNO-2]) {
	    left_ptrs[row][COLNO-1] = left_ptrs[row][COLNO-2];
	} else {
	    left_ptrs[row][COLNO-1] = COLNO-2;
	    for (i = left_ptrs[row][COLNO-2]; i < COLNO-1; i++)
		right_ptrs[row][i] = COLNO-2;
	}
    }

    /*
     * At this point, we know we aren't on the boundaries.
     */
    else if (viz_clear[row][col-1] && viz_clear[row][col+1]) {
	/* Both sides clear */
	for (i = left_ptrs[row][col-1]; i <= col; i++) {
	    if (!viz_clear[row][i]) continue;	/* catch non-end case */
	    right_ptrs[row][i] = right_ptrs[row][col+1];
	}
	for (i = col; i <= right_ptrs[row][col+1]; i++) {
	    if (!viz_clear[row][i]) continue;	/* catch non-end case */
	    left_ptrs[row][i] = left_ptrs[row][col-1];
	}

    } else if (viz_clear[row][col-1]) {
	/* Left side clear, right side blocked. */
	for (i = col+1; i <= right_ptrs[row][col+1]; i++)
	    left_ptrs[row][i] = col+1;

	for (i = left_ptrs[row][col-1]; i <= col; i++) {
	    if (!viz_clear[row][i]) continue;	/* catch non-end case */
	    right_ptrs[row][i] = col+1;
	}
	left_ptrs[row][col] = left_ptrs[row][col-1];

    } else if (viz_clear[row][col+1]) {
	/* Right side clear, left side blocked. */
	for (i = left_ptrs[row][col-1]; i < col; i++)
	    right_ptrs[row][i] = col-1;

	for (i = col; i <= right_ptrs[row][col+1]; i++) {
	    if (!viz_clear[row][i]) continue;	/* catch non-end case */
	    left_ptrs[row][i] = col-1;
	}
	right_ptrs[row][col] = right_ptrs[row][col+1];

    } else {
	/* Both sides blocked */
	for (i = left_ptrs[row][col-1]; i < col; i++)
	    right_ptrs[row][i] = col-1;

	for (i = col+1; i <= right_ptrs[row][col+1]; i++)
	    left_ptrs[row][i] = col+1;

	left_ptrs[row][col]  = col-1;
	right_ptrs[row][col] = col+1;
    }
}